

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O0

void __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::reMax
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,int newSize,int newHashSize)

{
  int iVar1;
  Element<soplex::NameSet::Name,_soplex::DataKey> *pEVar2;
  int in_EDX;
  DataKey *in_RDI;
  int i;
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  save;
  int in_stack_ffffffffffffff9c;
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  *in_stack_ffffffffffffffa0;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffffcc;
  DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *in_stack_ffffffffffffffd0;
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  local_28;
  int local_10;
  
  local_10 = in_EDX;
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  ::Array((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
           *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
          &in_stack_ffffffffffffffa8->m_elem);
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  ::reSize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  clear((DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *)
        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (local_10 < 1) {
    local_10 = autoHashSize(in_stack_ffffffffffffffa8);
  }
  in_RDI[3].info = local_10;
  iVar3 = 0;
  while (iVar4 = iVar3,
        iVar1 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                ::size((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
                        *)0x19ec82), iVar3 < iVar1) {
    pEVar2 = Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
             ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (pEVar2->stat == USED) {
      in_stack_ffffffffffffffa0 = &local_28;
      Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
      ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
      ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      add(in_stack_ffffffffffffffd0,(Name *)CONCAT44(in_stack_ffffffffffffffcc,iVar4),in_RDI);
    }
    iVar3 = iVar4 + 1;
  }
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  ::~Array((Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
            *)0x19ed1a);
  return;
}

Assistant:

void reMax(int newSize = -1, int newHashSize = 0)
   {
      Array< Elem > save(m_elem);

      m_elem.reSize(newSize < m_used ? m_used : newSize);

      clear();

      m_hashsize = (newHashSize < 1) ? autoHashSize() : newHashSize;

      for(int i = 0; i < save.size(); i++)
         if(save[i].stat == Elem::USED)
            add(save[i].item, save[i].info);
   }